

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

int mcu8str_is_ascii(mcu8str *str)

{
  ulong uVar1;
  
  if ((ulong)str->size != 0) {
    uVar1 = 0;
    do {
      if (str->c_str[uVar1] < '\0') {
        return 0;
      }
      uVar1 = uVar1 + 1;
    } while (str->size != uVar1);
  }
  return 1;
}

Assistant:

int mcu8str_is_ascii( const mcu8str* str )
  {
    const char * it = str->c_str;
    const char * itE = it + str->size;
    for ( ; it!=itE; ++it )
      if ( (unsigned char)(*it) >= 128 )
        return 0;
    return 1;
  }